

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

bool __thiscall Kernel::Term::computable(Term *this)

{
  bool bVar1;
  Symbol *this_00;
  Term *this_01;
  Term *in_RDI;
  TermList t;
  SubtermIterator sit;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  Signature *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  Term *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  bool local_1;
  
  functor(in_RDI);
  this_00 = Signature::getFunction(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  bVar1 = Signature::Symbol::computable(this_00);
  if (bVar1) {
    SubtermIterator::SubtermIterator
              ((SubtermIterator *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    do {
      bVar1 = SubtermIterator::hasNext
                        ((SubtermIterator *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (!bVar1) {
        local_1 = true;
        goto LAB_0098b488;
      }
      SubtermIterator::next
                ((SubtermIterator *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      bVar1 = TermList::isTerm((TermList *)0x98b3d7);
      if (!bVar1) break;
      this_01 = TermList::term((TermList *)0x98b401);
      in_stack_ffffffffffffff6c = functor(this_01);
      in_stack_ffffffffffffff60 =
           (Signature *)Signature::getFunction(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      bVar1 = Signature::Symbol::computable((Symbol *)in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff5c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
    } while (bVar1);
    local_1 = false;
LAB_0098b488:
    SubtermIterator::~SubtermIterator((SubtermIterator *)in_stack_ffffffffffffff60);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Term::computable() const {
  if (!env.signature->getFunction(this->functor())->computable()) {
    return false;
  }
  SubtermIterator sit(this);
  while (sit.hasNext()) {
    TermList t = sit.next();
    if (!t.isTerm() || !env.signature->getFunction(t.term()->functor())->computable()) {
      return false;
    }
  }
  return true;
}